

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswFilter.c
# Opt level: O2

void Ssw_ManFindStartingState(Ssw_Man_t *p,Abc_Cex_t *pCex)

{
  undefined1 *puVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  uint uVar7;
  int iVar8;
  Aig_Man_t *p_00;
  int iVar9;
  int i;
  
  for (iVar8 = 0; p_00 = p->pAig, iVar8 < p_00->nRegs; iVar8 = iVar8 + 1) {
    pvVar4 = Vec_PtrEntry(p_00->vCos,p_00->nTruePos + iVar8);
    *(byte *)((long)pvVar4 + 0x18) = *(byte *)((long)pvVar4 + 0x18) & 0xdf;
  }
  iVar8 = pCex->nRegs;
  for (iVar9 = 0; iVar9 <= pCex->iFrame; iVar9 = iVar9 + 1) {
    puVar1 = &p_00->pConst1->field_0x18;
    *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20;
    i = 0;
    while( true ) {
      iVar2 = iVar8 + i;
      p_00 = p->pAig;
      if (p_00->nTruePis <= i) break;
      pvVar4 = Vec_PtrEntry(p_00->vCis,i);
      *(ulong *)((long)pvVar4 + 0x18) =
           *(ulong *)((long)pvVar4 + 0x18) & 0xffffffffffffffdf |
           (ulong)(((uint)(&pCex[1].iPo)[iVar2 >> 5] >> ((byte)iVar2 & 0x1f) & 1) << 5);
      i = i + 1;
    }
    for (iVar8 = 0; iVar8 < p_00->nRegs; iVar8 = iVar8 + 1) {
      pAVar5 = Saig_ManLi(p_00,iVar8);
      pAVar6 = Saig_ManLo(p->pAig,iVar8);
      *(ulong *)&pAVar6->field_0x18 =
           *(ulong *)&pAVar6->field_0x18 & 0xffffffffffffffdf |
           (ulong)((uint)*(undefined8 *)&pAVar5->field_0x18 & 0x20);
      p_00 = p->pAig;
    }
    for (iVar8 = 0; iVar8 < p_00->vObjs->nSize; iVar8 = iVar8 + 1) {
      pvVar4 = Vec_PtrEntry(p_00->vObjs,iVar8);
      if ((pvVar4 != (void *)0x0) && (0xfffffffd < ((uint)*(ulong *)((long)pvVar4 + 0x18) & 7) - 7))
      {
        *(ulong *)((long)pvVar4 + 0x18) =
             *(ulong *)((long)pvVar4 + 0x18) & 0xffffffffffffffdf |
             (ulong)((((uint)*(ulong *)((long)pvVar4 + 0x10) ^
                      *(uint *)((*(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe) + 0x18) >> 5)
                      & ((uint)*(ulong *)((long)pvVar4 + 8) ^
                        *(uint *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) + 0x18) >> 5)
                     & 1) << 5);
      }
      p_00 = p->pAig;
    }
    for (iVar8 = 0; iVar8 < p_00->vCos->nSize; iVar8 = iVar8 + 1) {
      pvVar4 = Vec_PtrEntry(p_00->vCos,iVar8);
      *(ulong *)((long)pvVar4 + 0x18) =
           *(ulong *)((long)pvVar4 + 0x18) & 0xffffffffffffffdf |
           (ulong)(((int)*(ulong *)((long)pvVar4 + 8) << 5 ^
                   *(uint *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) + 0x18)) & 0x20);
      p_00 = p->pAig;
    }
    iVar8 = iVar2;
  }
  if (iVar8 == pCex->nBits) {
    for (iVar8 = 0; iVar8 < p_00->nRegs; iVar8 = iVar8 + 1) {
      pvVar4 = Vec_PtrEntry(p_00->vCis,p_00->nTruePis + iVar8);
      p_00 = p->pAig;
      uVar7 = p_00->nTruePis + iVar8;
      iVar9 = (int)uVar7 >> 5;
      uVar3 = p->pPatWords[iVar9];
      uVar7 = uVar7 & 0x1f;
      if (((uVar3 >> (sbyte)uVar7 ^ *(uint *)((long)pvVar4 + 0x18) >> 5) & 1) != 0) {
        p->pPatWords[iVar9] = uVar3 ^ 1 << uVar7;
      }
    }
    return;
  }
  __assert_fail("iBit == pCex->nBits",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswFilter.c"
                ,0xa3,"void Ssw_ManFindStartingState(Ssw_Man_t *, Abc_Cex_t *)");
}

Assistant:

void Ssw_ManFindStartingState( Ssw_Man_t * p, Abc_Cex_t * pCex )
{
    Aig_Obj_t * pObj, * pObjLi;
    int f, i, iBit;
    // assign register outputs
    Saig_ManForEachLi( p->pAig, pObj, i )
        pObj->fMarkB = 0;
    // simulate the timeframes
    iBit = pCex->nRegs;
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        // set the PI simulation information
        Aig_ManConst1(p->pAig)->fMarkB = 1;
        Saig_ManForEachPi( p->pAig, pObj, i )
            pObj->fMarkB = Abc_InfoHasBit( pCex->pData, iBit++ );
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObj, i )
            pObj->fMarkB = pObjLi->fMarkB;
        // simulate internal nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
            pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) )
                         & ( Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj) );
        // assign the COs
        Aig_ManForEachCo( p->pAig, pObj, i )
            pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) );
    }
    assert( iBit == pCex->nBits );
    // check that the output failed as expected -- cannot check because it is not an SRM!
//    pObj = Aig_ManCo( p->pAig, pCex->iPo );
//    if ( pObj->fMarkB != 1 )
//        Abc_Print( 1, "The counter-example does not refine the output.\n" );
    // record the new pattern
    Saig_ManForEachLo( p->pAig, pObj, i )
        if ( pObj->fMarkB ^ Abc_InfoHasBit(p->pPatWords, Saig_ManPiNum(p->pAig) + i) )
            Abc_InfoXorBit( p->pPatWords, Saig_ManPiNum(p->pAig) + i );
}